

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

bool __thiscall
BVSparse<Memory::JitArenaAllocator>::Equal
          (BVSparse<Memory::JitArenaAllocator> *this,BVSparse<Memory::JitArenaAllocator> *bv)

{
  Type TVar1;
  
  do {
    bv = (BVSparse<Memory::JitArenaAllocator> *)bv->head;
    do {
      this = (BVSparse<Memory::JitArenaAllocator> *)this->head;
      if (this == (BVSparse<Memory::JitArenaAllocator> *)0x0) break;
    } while (((Type *)&this->alloc)->word == 0);
    while( true ) {
      if (bv == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        return this == (BVSparse<Memory::JitArenaAllocator> *)0x0;
      }
      TVar1 = ((Type *)&bv->alloc)->word;
      if (TVar1 != 0) break;
      bv = (BVSparse<Memory::JitArenaAllocator> *)bv->head;
    }
    if (((this == (BVSparse<Memory::JitArenaAllocator> *)0x0) ||
        (*(Type *)&this->lastFoundIndex != *(Type *)&bv->lastFoundIndex)) ||
       (((Type *)&this->alloc)->word != TVar1)) {
      return false;
    }
  } while( true );
}

Assistant:

bool
BVSparse<TAllocator>::Equal(BVSparse const * bv) const
{
    BVSparseNode const * bvNode1 = this->head;
    BVSparseNode const * bvNode2 = bv->head;

    while (true)
    {
        while (bvNode1 != nullptr && bvNode1->data.IsEmpty())
        {
            bvNode1 = bvNode1->next;
        }
        while (bvNode2 != nullptr && bvNode2->data.IsEmpty())
        {
            bvNode2 = bvNode2->next;
        }
        if (bvNode1 == nullptr)
        {
            return (bvNode2 == nullptr);
        }
        if (bvNode2 == nullptr)
        {
            return false;
        }
        if (bvNode1->startIndex != bvNode2->startIndex)
        {
            return false;
        }
        if (!bvNode1->data.Equal(bvNode2->data))
        {
            return false;
        }
        bvNode1 = bvNode1->next;
        bvNode2 = bvNode2->next;
    }
}